

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.h
# Opt level: O3

void __thiscall FPortalBlockmap::Clear(FPortalBlockmap *this)

{
  uint uVar1;
  
  uVar1 = (this->data).Count;
  if (uVar1 != 0) {
    TArray<FPortalBlock,_FPortalBlock>::DoDelete(&this->data,0,uVar1 - 1);
    (this->data).Count = 0;
  }
  TArray<FPortalBlock,_FPortalBlock>::ShrinkToFit(&this->data);
  *(undefined4 *)((long)&this->dy + 3) = 0;
  this->dx = 0;
  this->dy = 0;
  return;
}

Assistant:

void Clear()
	{
		data.Clear();
		data.ShrinkToFit();
		dx = dy = 0;
		containsLines = false;
		hasLinkedPolyPortals = false;
		hasLinkedSectorPortals = false;
	}